

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O1

bool Args::details::argNameLess<Args::ArgIface*>(ArgIface **a1,ArgIface **a2)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  long *local_d0;
  ulong local_c8;
  long local_c0 [2];
  long *local_b0;
  ulong local_a8;
  long local_a0 [2];
  long *local_90;
  ulong local_88;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  (*(*a1)->_vptr_ArgIface[3])(&local_d0);
  if (local_c8 == 0) {
    bVar5 = false;
  }
  else {
    (*(*a2)->_vptr_ArgIface[3])(&local_50);
    bVar5 = local_48 != 0;
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (bVar5) {
    (*(*a1)->_vptr_ArgIface[3])(&local_d0);
    if ((char)*local_d0 == '-') {
      bVar5 = false;
    }
    else {
      (*(*a2)->_vptr_ArgIface[3])(&local_b0);
      bVar5 = (char)*local_b0 == '-';
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    if (bVar5) {
      return true;
    }
    (*(*a1)->_vptr_ArgIface[3])(&local_d0);
    if ((char)*local_d0 == '-') {
      (*(*a2)->_vptr_ArgIface[3])(local_70);
      bVar5 = (char)*local_70[0] != '-';
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
    else {
      bVar5 = false;
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    if (!bVar5) {
      iVar1 = (*(*a1)->_vptr_ArgIface[8])();
      if ((*(long *)(CONCAT44(extraout_var,iVar1) + 8) == 0) &&
         (iVar1 = (*(*a2)->_vptr_ArgIface[8])(), *(long *)(CONCAT44(extraout_var_02,iVar1) + 8) != 0
         )) {
        return true;
      }
      iVar1 = (*(*a1)->_vptr_ArgIface[8])();
      if ((*(long *)(CONCAT44(extraout_var_00,iVar1) + 8) == 0) ||
         (iVar1 = (*(*a2)->_vptr_ArgIface[8])(), *(long *)(CONCAT44(extraout_var_01,iVar1) + 8) != 0
         )) {
        (*(*a1)->_vptr_ArgIface[3])(&local_d0);
        (*(*a2)->_vptr_ArgIface[3])(&local_90);
        uVar3 = local_c8;
        if (local_88 < local_c8) {
          uVar3 = local_88;
        }
        if (uVar3 == 0) {
          uVar3 = 0;
        }
        else {
          uVar2 = memcmp(local_d0,local_90,uVar3);
          uVar3 = (ulong)uVar2;
        }
        if ((int)uVar3 == 0) {
          uVar3 = 0xffffffff80000000;
          if (-0x80000000 < (long)(local_c8 - local_88)) {
            uVar3 = local_c8 - local_88;
          }
          if (0x7ffffffe < (long)uVar3) {
            uVar3 = 0;
          }
        }
        bVar4 = (byte)(uVar3 >> 0x18);
        local_a0[0] = local_80[0];
        local_b0 = local_90;
        if (local_90 != local_80) goto LAB_00125f4d;
        goto LAB_00125f55;
      }
    }
    bVar5 = false;
  }
  else {
    (*(*a1)->_vptr_ArgIface[3])(&local_d0);
    (*(*a2)->_vptr_ArgIface[3])(&local_b0);
    uVar3 = local_c8;
    if (local_a8 < local_c8) {
      uVar3 = local_a8;
    }
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar2 = memcmp(local_d0,local_b0,uVar3);
      uVar3 = (ulong)uVar2;
    }
    if ((int)uVar3 == 0) {
      uVar3 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_c8 - local_a8)) {
        uVar3 = local_c8 - local_a8;
      }
      if (0x7ffffffe < (long)uVar3) {
        uVar3 = 0;
      }
    }
    bVar4 = (byte)(uVar3 >> 0x18);
    if (local_b0 != local_a0) {
LAB_00125f4d:
      operator_delete(local_b0,local_a0[0] + 1);
    }
LAB_00125f55:
    bVar5 = (bool)(bVar4 >> 7);
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
  }
  return bVar5;
}

Assistant:

bool argNameLess( const T & a1, const T & a2 )
{
	static const Char dash = SL( '-' );

	if( !a1->name().empty() && !a2->name().empty() )
	{
		if( *( a1->name().cbegin() ) != dash &&
				*( a2->name().cbegin() ) == dash )
			return true;
		else if( *( a1->name().cbegin() ) == dash &&
				*( a2->name().cbegin() ) != dash )
			return false;
		else if( a1->argumentName().empty() && !a2->argumentName().empty() )
			return true;
		else if( !a1->argumentName().empty() && a2->argumentName().empty() )
			return false;
		else
			return ( a1->name() < a2->name() );
	}
	else
		return ( a1->name() < a2->name() );
}